

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_zip_jar.c
# Opt level: O3

void test_read_format_zip_jar(void)

{
  wchar_t wVar1;
  int iVar2;
  mode_t mVar3;
  char *buff;
  archive *_a;
  char *v2;
  la_int64_t v2_00;
  la_ssize_t v2_01;
  archive_entry *ae;
  size_t s;
  char data [16];
  archive_entry *local_58;
  size_t local_50;
  undefined1 local_48 [24];
  
  extract_reference_file("test_read_format_zip_jar.jar");
  buff = slurpfile(&local_50,"%s","test_read_format_zip_jar.jar");
  _a = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_jar.c"
                   ,L',',(uint)(_a != (archive *)0x0),"(a = archive_read_new()) != NULL",(void *)0x0
                  );
  wVar1 = archive_read_support_format_zip_seekable(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_jar.c"
                      ,L'-',0,"ARCHIVE_OK",(long)wVar1,"archive_read_support_format_zip_seekable(a)"
                      ,_a);
  iVar2 = read_open_memory_seek(_a,buff,local_50,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_jar.c"
                      ,L'.',0,"ARCHIVE_OK",(long)iVar2,"read_open_memory_seek(a, p, s, 1)",_a);
  iVar2 = archive_read_next_header(_a,&local_58);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_jar.c"
                      ,L'0',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",_a);
  v2 = archive_entry_pathname(local_58);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_jar.c"
             ,L'1',"somedir/","\"somedir/\"",v2,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar3 = archive_entry_mode(local_58);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_jar.c"
                      ,L'2',0x41fd,"AE_IFDIR | 0775",(ulong)mVar3,"archive_entry_mode(ae)",
                      (void *)0x0);
  v2_00 = archive_entry_size(local_58);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_jar.c"
                      ,L'3',0,"0",v2_00,"archive_entry_size(ae)",(void *)0x0);
  v2_01 = archive_read_data(_a,local_48,0x10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_jar.c"
                      ,L'4',0,"0",v2_01,"archive_read_data(a, data, 16)",_a);
  iVar2 = archive_read_next_header(_a,&local_58);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_jar.c"
                      ,L'6',1,"ARCHIVE_EOF",(long)iVar2,"archive_read_next_header(a, &ae)",_a);
  iVar2 = archive_read_close(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_jar.c"
                      ,L'7',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",_a);
  iVar2 = archive_read_free(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_jar.c"
                      ,L'8',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",_a);
  free(buff);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_zip_jar)
{
	const char *refname = "test_read_format_zip_jar.jar";
	char *p;
	size_t s;
	struct archive *a;
	struct archive_entry *ae;
	char data[16];

	extract_reference_file(refname);
	p = slurpfile(&s, "%s", refname);

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_zip_seekable(a));
	assertEqualIntA(a, ARCHIVE_OK, read_open_memory_seek(a, p, s, 1));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("somedir/", archive_entry_pathname(ae));
	assertEqualInt(AE_IFDIR | 0775, archive_entry_mode(ae));
	assertEqualInt(0, archive_entry_size(ae));
	assertEqualIntA(a, 0, archive_read_data(a, data, 16));

	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_free(a));
	free(p);
}